

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O1

string * IOcontroller::get_out_file_name
                   (string *__return_storage_ptr__,string *graphName,string *algName,int seedsize,
                   string *probDist,float probEdge)

{
  pointer pcVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  size_type *psVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 uVar12;
  ulong *puVar13;
  uint uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  ulong *local_118;
  long local_110;
  ulong local_108;
  undefined8 uStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  float local_74;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_74 = probEdge;
  iVar5 = std::__cxx11::string::compare((char *)probDist);
  cVar2 = (char)(seedsize >> 0x1f);
  if (iVar5 == 0) {
    local_138 = local_128;
    pcVar1 = (graphName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar1,pcVar1 + graphName->_M_string_length);
    std::__cxx11::string::append((char *)&local_138);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_138,(ulong)(algName->_M_dataplus)._M_p);
    local_f8 = &local_e8;
    puVar13 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar13) {
      local_e8 = *puVar13;
      lStack_e0 = plVar6[3];
    }
    else {
      local_e8 = *puVar13;
      local_f8 = (ulong *)*plVar6;
    }
    local_f0 = plVar6[1];
    *plVar6 = (long)puVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    puVar13 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar13) {
      local_c8 = *puVar13;
      lStack_c0 = plVar6[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar13;
      local_d8 = (ulong *)*plVar6;
    }
    local_d0 = plVar6[1];
    *plVar6 = (long)puVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    uVar11 = -seedsize;
    if (0 < seedsize) {
      uVar11 = seedsize;
    }
    uVar14 = 1;
    if (9 < uVar11) {
      uVar10 = (ulong)uVar11;
      uVar4 = 4;
      do {
        uVar14 = uVar4;
        uVar8 = (uint)uVar10;
        if (uVar8 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_00120ad8;
        }
        if (uVar8 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_00120ad8;
        }
        if (uVar8 < 10000) goto LAB_00120ad8;
        uVar10 = uVar10 / 10000;
        uVar4 = uVar14 + 4;
      } while (99999 < uVar8);
      uVar14 = uVar14 + 1;
    }
LAB_00120ad8:
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar14 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)seedsize >> 0x1f) + (long)local_70),uVar14,uVar11);
    uVar10 = 0xf;
    if (local_d8 != &local_c8) {
      uVar10 = local_c8;
    }
    if (uVar10 < (ulong)(local_68 + local_d0)) {
      uVar10 = 0xf;
      if (local_70 != local_60) {
        uVar10 = local_60[0];
      }
      if (uVar10 < (ulong)(local_68 + local_d0)) goto LAB_00120b61;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_00120b61:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_70);
    }
    local_118 = &local_108;
    puVar13 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar13) {
      local_108 = *puVar13;
      uStack_100 = puVar7[3];
    }
    else {
      local_108 = *puVar13;
      local_118 = (ulong *)*puVar7;
    }
    local_110 = puVar7[1];
    *puVar7 = puVar13;
    puVar7[1] = 0;
    *(undefined1 *)puVar13 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_a8 = *plVar6;
      uStack_a0 = puVar7[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar6;
      local_b8 = (long *)*puVar7;
    }
    local_b0 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b8,(ulong)(probDist->_M_dataplus)._M_p);
    puVar13 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar13) {
      local_88 = *puVar13;
      lStack_80 = plVar6[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *puVar13;
      local_98 = (ulong *)*plVar6;
    }
    local_90 = plVar6[1];
    *plVar6 = (long)puVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_50,vsnprintf,0x3a,"%f",SUB84((double)local_74,0));
    uVar10 = 0xf;
    if (local_98 != &local_88) {
      uVar10 = local_88;
    }
    if (uVar10 < local_50._M_string_length + local_90) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar12 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_50._M_string_length + local_90) goto LAB_00120d17;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_98);
    }
    else {
LAB_00120d17:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_50._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = puVar7 + 2;
    if ((size_type *)*puVar7 == psVar9) {
      uVar12 = puVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar12;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = puVar7[1];
    *puVar7 = psVar9;
    puVar7[1] = 0;
    *(undefined1 *)psVar9 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    puVar13 = local_138;
    if (local_138 == local_128) {
      return __return_storage_ptr__;
    }
    goto LAB_00120e59;
  }
  local_f8 = &local_e8;
  pcVar1 = (graphName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar1,pcVar1 + graphName->_M_string_length);
  std::__cxx11::string::append((char *)&local_f8);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f8,(ulong)(algName->_M_dataplus)._M_p);
  local_d8 = &local_c8;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_c8 = *puVar13;
    lStack_c0 = plVar6[3];
  }
  else {
    local_c8 = *puVar13;
    local_d8 = (ulong *)*plVar6;
  }
  local_d0 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_108 = *puVar13;
    uStack_100 = puVar7[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar13;
    local_118 = (ulong *)*puVar7;
  }
  local_110 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  uVar11 = -seedsize;
  if (0 < seedsize) {
    uVar11 = seedsize;
  }
  uVar14 = 1;
  if (9 < uVar11) {
    uVar10 = (ulong)uVar11;
    uVar4 = 4;
    do {
      uVar14 = uVar4;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_00120894;
      }
      if (uVar8 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_00120894;
      }
      if (uVar8 < 10000) goto LAB_00120894;
      uVar10 = uVar10 / 10000;
      uVar4 = uVar14 + 4;
    } while (99999 < uVar8);
    uVar14 = uVar14 + 1;
  }
LAB_00120894:
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar14 - cVar2);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)seedsize >> 0x1f) + (long)local_138),uVar14,uVar11);
  uVar10 = 0xf;
  if (local_118 != &local_108) {
    uVar10 = local_108;
  }
  if (uVar10 < (ulong)(local_130 + local_110)) {
    uVar10 = 0xf;
    if (local_138 != local_128) {
      uVar10 = local_128[0];
    }
    if (uVar10 < (ulong)(local_130 + local_110)) goto LAB_00120907;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_118);
  }
  else {
LAB_00120907:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_138);
  }
  local_b8 = &local_a8;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_a8 = *plVar6;
    uStack_a0 = puVar7[3];
  }
  else {
    local_a8 = *plVar6;
    local_b8 = (long *)*puVar7;
  }
  local_b0 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_88 = *puVar13;
    lStack_80 = plVar6[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar13;
    local_98 = (ulong *)*plVar6;
  }
  local_90 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_98,(ulong)(probDist->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  local_128[0] = local_e8;
  puVar13 = local_f8;
  if (local_f8 == &local_e8) {
    return __return_storage_ptr__;
  }
LAB_00120e59:
  operator_delete(puVar13,local_128[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_out_file_name(const std::string graphName, const std::string algName, const int seedsize,
                                         const std::string probDist, const float probEdge)
    {
        if (probDist == "UNI")
        {
            return graphName + "_" + algName + "_k" + std::to_string(seedsize) + "_" + probDist + std::
            to_string(probEdge);
        }
        return graphName + "_" + algName + "_k" + std::to_string(seedsize) + "_" + probDist;
    }